

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O3

bitcount_t tc_uECC_vli_numBits(tc_uECC_word_t *vli,wordcount_t max_words)

{
  int iVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  short sVar5;
  uint uVar6;
  
  uVar6 = (uint)(byte)max_words;
  uVar4 = uVar6 + 1;
  cVar2 = -1;
  if ((char)(max_words + -1) < -1) {
    cVar2 = max_words + -1;
  }
  do {
    uVar6 = uVar6 - 1;
    bVar3 = cVar2 + 1;
    if ((char)uVar6 < '\0') break;
    bVar3 = (char)uVar4 - 1;
    uVar4 = (uint)bVar3;
  } while (vli[uVar6 & 0x7f] == 0);
  if (bVar3 == 0) {
    sVar5 = 0;
  }
  else {
    uVar6 = vli[(long)(char)bVar3 + -1];
    iVar1 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar5 = ((ushort)iVar1 ^ 0xffe0) + 0x21;
    if (uVar6 == 0) {
      sVar5 = 0;
    }
    sVar5 = (char)bVar3 * 0x20 + sVar5 + -0x20;
  }
  return sVar5;
}

Assistant:

bitcount_t tc_uECC_vli_numBits(const tc_uECC_word_t *vli,
			    const wordcount_t max_words)
{

	tc_uECC_word_t i;
	tc_uECC_word_t digit;

	wordcount_t num_digits = vli_numDigits(vli, max_words);
	if (num_digits == 0) {
		return 0;
	}

	digit = vli[num_digits - 1];
	for (i = 0; digit; ++i) {
		digit >>= 1;
	}

	return (((bitcount_t)(num_digits - 1) << tc_uECC_WORD_BITS_SHIFT) + i);
}